

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O1

int stbi__jpeg_huff_decode(stbi__jpeg *j,stbi__huffman *h)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar2 = j->code_buffer;
  uVar5 = (ulong)h->fast[uVar2 >> 0x17];
  if (uVar5 == 0xff) {
    lVar7 = 0;
    do {
      lVar6 = lVar7;
      lVar7 = lVar6 + 1;
    } while (h->maxcode[lVar6 + 10] <= uVar2 >> 0x10);
    iVar3 = j->code_bits;
    if (lVar7 == 8) {
      j->code_bits = iVar3 + -0x10;
      uVar4 = 0xffffffff;
    }
    else {
      uVar4 = 0xffffffff;
      if (((int)(lVar6 + 10) <= iVar3) &&
         (uVar8 = (uVar2 >> (0x17U - (char)lVar7 & 0x1f) & stbi__bmask[lVar6 + 10]) +
                  h->delta[lVar6 + 10], uVar8 < 0x100)) {
        if ((uVar2 >> (-h->size[uVar8] & 0x1f) & stbi__bmask[h->size[uVar8]]) !=
            (uint)h->code[uVar8]) {
          __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image.h"
                        ,0x85c,"int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)");
        }
        j->code_bits = (iVar3 - (int)lVar7) + -9;
        j->code_buffer = uVar2 << ((byte)(lVar6 + 10) & 0x1f);
        uVar4 = (uint)h->values[uVar8];
      }
    }
  }
  else {
    bVar1 = h->size[uVar5];
    uVar4 = 0xffffffff;
    if ((int)(uint)bVar1 <= j->code_bits) {
      j->code_buffer = uVar2 << (bVar1 & 0x1f);
      j->code_bits = j->code_bits - (uint)bVar1;
      uVar4 = (uint)h->values[uVar5];
    }
  }
  return uVar4;
}

Assistant:

stbi_inline static int stbi__jpeg_huff_decode(stbi__jpeg *j, stbi__huffman *h)
{
   unsigned int temp;
   int c,k;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   // look at the top FAST_BITS and determine what symbol ID it is,
   // if the code is <= FAST_BITS
   c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
   k = h->fast[c];
   if (k < 255) {
      int s = h->size[k];
      if (s > j->code_bits)
         return -1;
      j->code_buffer <<= s;
      j->code_bits -= s;
      return h->values[k];
   }

   // naive test is to shift the code_buffer down so k bits are
   // valid, then test against maxcode. To speed this up, we've
   // preshifted maxcode left so that it has (16-k) 0s at the
   // end; in other words, regardless of the number of bits, it
   // wants to be compared against something shifted to have 16;
   // that way we don't need to shift inside the loop.
   temp = j->code_buffer >> 16;
   for (k=FAST_BITS+1 ; ; ++k)
      if (temp < h->maxcode[k])
         break;
   if (k == 17) {
      // error! code not found
      j->code_bits -= 16;
      return -1;
   }

   if (k > j->code_bits)
      return -1;

   // convert the huffman code to the symbol id
   c = ((j->code_buffer >> (32 - k)) & stbi__bmask[k]) + h->delta[k];
   if(c < 0 || c >= 256) // symbol id out of bounds!
       return -1;
   STBI_ASSERT((((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]);

   // convert the id to a symbol
   j->code_bits -= k;
   j->code_buffer <<= k;
   return h->values[c];
}